

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O0

int fetch_all_frequencies_db(feed_db_t *db,frequency_t **records)

{
  int iVar1;
  void *pvVar2;
  uchar *puVar3;
  char local_e8 [8];
  char qr [83];
  sqlite3_stmt *stmt;
  int i;
  int record_count;
  feed_db_status_t res;
  frequency_t record;
  frequency_t **records_local;
  feed_db_t *db_local;
  
  record._84_8_ = records;
  db_local._4_4_ = count_rows_db(db,"frequencies");
  stmt._0_4_ = 0;
  if (0 < db_local._4_4_) {
    memcpy(local_e8,
           "SELECT trip_id, start_time, end_time,headway_secs, exact_times FROM `frequencies`;",0x53
          );
    sqlite3_prepare_v2(db->conn,local_e8,-1,(sqlite3_stmt **)(qr + 0x50),(char **)0x0);
    pvVar2 = malloc((long)db_local._4_4_ * 0x5c);
    *(void **)record._84_8_ = pvVar2;
    if (*(long *)record._84_8_ == 0) {
      sqlite3_finalize(stack0xffffffffffffff70);
      db_local._4_4_ = -1;
    }
    else {
      do {
        iVar1 = sqlite3_step(stack0xffffffffffffff70);
        db->rc = iVar1;
        if (iVar1 != 100) break;
        init_frequency((frequency_t *)&record_count);
        puVar3 = sqlite3_column_text(stack0xffffffffffffff70,0);
        strcpy((char *)&record_count,(char *)puVar3);
        puVar3 = sqlite3_column_text(stack0xffffffffffffff70,1);
        strcpy(record.trip_id + 0x38,(char *)puVar3);
        puVar3 = sqlite3_column_text(stack0xffffffffffffff70,2);
        strcpy(record.start_time + 1,(char *)puVar3);
        record.end_time._3_4_ = sqlite3_column_int(stack0xffffffffffffff70,3);
        record._80_4_ = sqlite3_column_int(stack0xffffffffffffff70,4);
        memcpy((void *)(*(long *)record._84_8_ + (long)(int)stmt * 0x5c),&record_count,0x5c);
        stmt._0_4_ = (int)stmt + 1;
      } while ((int)stmt < db_local._4_4_);
      sqlite3_finalize(stack0xffffffffffffff70);
    }
  }
  return db_local._4_4_;
}

Assistant:

int fetch_all_frequencies_db(feed_db_t *db, frequency_t **records) {

    frequency_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "frequencies");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "trip_id, start_time, end_time,"
                    "headway_secs, exact_times "
                "FROM `frequencies`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_frequency(&record);

        strcpy(record.trip_id, sqlite3_column_text(stmt, 0));
        strcpy(record.start_time, sqlite3_column_text(stmt, 1));
        strcpy(record.end_time, sqlite3_column_text(stmt, 2));
        record.headway_secs = sqlite3_column_int(stmt, 3);
        record.exact_times = (time_exactness_t)sqlite3_column_int(stmt, 4);

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}